

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::sampleNearest1D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,IVec2 *offset)

{
  int iVar1;
  int c;
  float fVar2;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  Vec4 VVar3;
  
  iVar1 = (access->m_size).m_data[0];
  fVar2 = floorf(u);
  c = (int)fVar2 + offset->m_data[0];
  if ((sampler->wrapS == CLAMP_TO_BORDER) && (c < 0 || iVar1 <= c)) {
    VVar3 = lookupBorder(this,&access->m_format,sampler);
  }
  else {
    iVar1 = wrap(sampler->wrapS,c,iVar1);
    VVar3 = lookup((ConstPixelBufferAccess *)this,(int)access,iVar1,offset->m_data[1]);
  }
  VVar3.m_data[0] = VVar3.m_data[0];
  auVar4._4_4_ = VVar3.m_data[1];
  register0x00001240 = VVar3.m_data[2];
  register0x00001244 = VVar3.m_data[3];
  return (Vec4)VVar3.m_data;
}

Assistant:

static Vec4 sampleNearest1D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, const IVec2& offset)
{
	int width	= access.getWidth();

	int x = deFloorFloatToInt32(u)+offset.x();

	// Check for CLAMP_TO_BORDER.
	if (sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);

	return lookup(access, i, offset.y(), 0);
}